

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

void __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::resetAll
          (SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *this,BumpAllocator *alloc,
          span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> children)

{
  int iVar1;
  size_type sVar2;
  undefined4 extraout_var;
  pointer pTVar3;
  EVP_PKEY_CTX *src;
  pointer extraout_RDX;
  EVP_PKEY_CTX *in_RSI;
  span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_RDI;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> buffer;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> *this_00;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> local_68;
  EVP_PKEY_CTX *local_20;
  
  local_20 = in_RSI;
  sVar2 = std::span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL>::size
                    ((span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x3383d6);
  this_00 = &local_68;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL>::SmallVector(this_00,sVar2);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::
  append_range<std::span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL>_>
            (&this_00->super_SmallVectorBase<slang::syntax::TokenOrSyntax>,in_RDI);
  iVar1 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&local_68.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,local_20,src);
  in_RDI[2]._M_extent._M_extent_value = CONCAT44(extraout_var,iVar1);
  in_RDI[3]._M_ptr = extraout_RDX;
  pTVar3 = (pointer)SmallVectorBase<slang::syntax::TokenOrSyntax>::size
                              (&local_68.super_SmallVectorBase<slang::syntax::TokenOrSyntax>);
  in_RDI[2]._M_ptr = pTVar3;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_2UL> *)0x338460);
  return;
}

Assistant:

void resetAll(BumpAllocator& alloc, std::span<const TokenOrSyntax> children) final {
        SmallVector<TokenOrSyntax> buffer(children.size(), UninitializedTag());
        buffer.append_range(children);

        elements = buffer.copy(alloc);
        childCount = buffer.size();
    }